

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int UnixVfs_Filetype(char *zPath,jx9_context *pCtx)

{
  int iVar1;
  char *zString;
  stat st;
  stat sStack_98;
  
  iVar1 = stat(zPath,&sStack_98);
  if (iVar1 != 0) {
    jx9_value_string(pCtx->pRet,"unknown",7);
    return -1;
  }
  switch((sStack_98.st_mode & 0xf000) - 0x1000 >> 0xc) {
  case 0:
    zString = "fifo";
    goto LAB_00141b4b;
  default:
    zString = "unknown";
    iVar1 = 7;
    break;
  case 3:
    zString = "dir";
    iVar1 = 3;
    break;
  case 5:
    zString = "block";
    iVar1 = 5;
    break;
  case 7:
    zString = "file";
    goto LAB_00141b4b;
  case 9:
    zString = "link";
LAB_00141b4b:
    iVar1 = 4;
    break;
  case 0xb:
    zString = "socket";
    iVar1 = 6;
  }
  jx9_value_string(pCtx->pRet,zString,iVar1);
  return 0;
}

Assistant:

static int UnixVfs_Filetype(const char *zPath, jx9_context *pCtx)
{
	struct stat st;
	int rc;
    rc = stat(zPath, &st);
	if( rc != 0 ){
	  /* Expand 'unknown' */
	  jx9_result_string(pCtx, "unknown", sizeof("unknown")-1);
	  return -1;
	}
	if(S_ISREG(st.st_mode) ){
		jx9_result_string(pCtx, "file", sizeof("file")-1);
	}else if(S_ISDIR(st.st_mode)){
		jx9_result_string(pCtx, "dir", sizeof("dir")-1);
	}else if(S_ISLNK(st.st_mode)){
		jx9_result_string(pCtx, "link", sizeof("link")-1);
	}else if(S_ISBLK(st.st_mode)){
		jx9_result_string(pCtx, "block", sizeof("block")-1);
    }else if(S_ISSOCK(st.st_mode)){
		jx9_result_string(pCtx, "socket", sizeof("socket")-1);
	}else if(S_ISFIFO(st.st_mode)){
       jx9_result_string(pCtx, "fifo", sizeof("fifo")-1);
	}else{
		jx9_result_string(pCtx, "unknown", sizeof("unknown")-1);
	}
	return JX9_OK;
}